

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

ArrayPtr<capnp::word> __thiscall
capnp::FlatMessageBuilder::allocateSegment(FlatMessageBuilder *this,uint minimumSize)

{
  Fault local_30;
  Fault f;
  uint minimumSize_local;
  FlatMessageBuilder *this_local;
  
  if (((this->allocated ^ 0xffU) & 1) == 0) {
    f.exception._4_4_ = minimumSize;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0x122,FAILED,"!allocated","\"FlatMessageBuilder\'s buffer was not large enough.\"",
               (char (*) [50])"FlatMessageBuilder\'s buffer was not large enough.");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  this->allocated = true;
  return this->array;
}

Assistant:

kj::ArrayPtr<word> FlatMessageBuilder::allocateSegment(uint minimumSize) {
  KJ_REQUIRE(!allocated, "FlatMessageBuilder's buffer was not large enough.");
  allocated = true;
  return array;
}